

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::EliminateDeadMembersPass::FindLiveMembers(EliminateDeadMembersPass *this)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  Instruction *this_00;
  Module *this_01;
  reference function;
  Function *func;
  iterator __end2_1;
  iterator __begin2_1;
  Module *__range2_1;
  uint32_t storage_class;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  EliminateDeadMembersPass *this_local;
  
  Pass::get_module((Pass *)this);
  Module::types_values((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst);
  while (bVar1 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&inst), bVar1) {
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    OVar2 = opt::Instruction::opcode(this_00);
    if (OVar2 == OpSpecConstantOp) {
      uVar3 = opt::Instruction::GetSingleWordInOperand(this_00,0);
      switch(uVar3) {
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x46:
        __assert_fail("false && \"Not implemented yet.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                      ,0x37,"void spvtools::opt::EliminateDeadMembersPass::FindLiveMembers()");
      default:
        break;
      case 0x51:
        MarkMembersAsLiveForExtract(this,this_00);
        break;
      case 0x52:
      }
    }
    else {
      OVar2 = opt::Instruction::opcode(this_00);
      if (OVar2 == OpVariable) {
        uVar3 = opt::Instruction::GetSingleWordInOperand(this_00,0);
        if ((uVar3 | 2) == 3) {
          uVar3 = opt::Instruction::type_id(this_00);
          MarkPointeeTypeAsFullUsed(this,uVar3);
        }
        else {
          bVar1 = opt::Instruction::IsVulkanStorageBufferVariable(this_00);
          if (bVar1) {
            uVar3 = opt::Instruction::type_id(this_00);
            MarkPointeeTypeAsFullUsed(this,uVar3);
          }
        }
      }
      else {
        OVar2 = opt::Instruction::opcode(this_00);
        if ((OVar2 == OpTypePointer) &&
           (uVar3 = opt::Instruction::GetSingleWordInOperand(this_00,0), uVar3 == 0x14e5)) {
          uVar3 = opt::Instruction::GetSingleWordInOperand(this_00,1);
          MarkTypeAsFullyUsed(this,uVar3);
        }
      }
    }
    InstructionList::iterator::operator++(&__end2);
  }
  this_01 = Pass::get_module((Pass *)this);
  join_0x00000010_0x00000000_ = Module::begin(this_01);
  _func = Module::end(this_01);
  while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                            &__end2_1.iterator_,
                            (UptrVectorIterator<spvtools::opt::Function,_false> *)&func), bVar1) {
    function = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                         ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2_1.iterator_)
    ;
    FindLiveMembers(this,function);
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2_1.iterator_);
  }
  return;
}

Assistant:

void EliminateDeadMembersPass::FindLiveMembers() {
  // Until we have implemented the rewriting of OpSpecConsantOp instructions,
  // we have to mark them as fully used just to be safe.
  for (auto& inst : get_module()->types_values()) {
    if (inst.opcode() == spv::Op::OpSpecConstantOp) {
      switch (spv::Op(inst.GetSingleWordInOperand(kSpecConstOpOpcodeIdx))) {
        case spv::Op::OpCompositeExtract:
          MarkMembersAsLiveForExtract(&inst);
          break;
        case spv::Op::OpCompositeInsert:
          // Nothing specific to do.
          break;
        case spv::Op::OpAccessChain:
        case spv::Op::OpInBoundsAccessChain:
        case spv::Op::OpPtrAccessChain:
        case spv::Op::OpInBoundsPtrAccessChain:
          assert(false && "Not implemented yet.");
          break;
        default:
          break;
      }
    } else if (inst.opcode() == spv::Op::OpVariable) {
      switch (spv::StorageClass(inst.GetSingleWordInOperand(0))) {
        case spv::StorageClass::Input:
        case spv::StorageClass::Output:
          MarkPointeeTypeAsFullUsed(inst.type_id());
          break;
        default:
          // Ignore structured buffers as layout(offset) qualifiers cannot be
          // applied to structure fields
          if (inst.IsVulkanStorageBufferVariable())
            MarkPointeeTypeAsFullUsed(inst.type_id());
          break;
      }
    } else if (inst.opcode() == spv::Op::OpTypePointer) {
      uint32_t storage_class = inst.GetSingleWordInOperand(0);
      if (storage_class == uint32_t(spv::StorageClass::PhysicalStorageBuffer)) {
        MarkTypeAsFullyUsed(inst.GetSingleWordInOperand(1));
      }
    }
  }

  for (const Function& func : *get_module()) {
    FindLiveMembers(func);
  }
}